

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void * parse_class(Parser *parser,Modifier *modifier)

{
  Token *name_00;
  Token *data;
  List *extends_00;
  BlockStmt *block_00;
  ClassStmt *pCVar1;
  BlockStmt *block;
  Token *super;
  List *extends;
  Token *name;
  Modifier *modifier_local;
  Parser *parser_local;
  
  name_00 = parser->token;
  expect(parser,ID);
  break_newline(parser);
  extends_00 = new_list();
  if (parser->token->kind == COLON) {
    bmove(parser);
    while (data = parser->token, data->kind != OP_FL_BRA) {
      expect(parser,ID);
      list_add(extends_00,data);
      if (parser->token->kind == COMM) {
        bmove(parser);
      }
    }
  }
  block_00 = (BlockStmt *)parse_class_block(parser);
  pCVar1 = new_class_stmt(name_00,extends_00,block_00,modifier);
  return pCVar1;
}

Assistant:

void *parse_class(Parser *parser, Modifier *modifier) {
    Token *name = token(parser);
    expect(parser, ID);
    break_newline(parser);
    List *extends = new_list();
    // 解析继承关系
    if (token(parser)->kind == COLON) {
        bmove(parser);
        Token *super;
        while ((super = token(parser))->kind != OP_FL_BRA) {
            expect(parser, ID);
            list_add(extends, super);
            if (token(parser)->kind == COMM){
                bmove(parser);
            }
        }
    }
    BlockStmt *block = parse_class_block(parser);
    return new_class_stmt(name, extends, block, modifier);
}